

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O1

void tcmalloc::CentralCacheLockAll(void)

{
  SpinLock *pSVar1;
  ulong uVar2;
  bool bVar3;
  
  LOCK();
  bVar3 = Static::pageheap_._8_4_ == 0;
  if (bVar3) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar3) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  if (DAT_00145490 != 0) {
    pSVar1 = (SpinLock *)&Static::central_cache_;
    uVar2 = 0;
    do {
      LOCK();
      bVar3 = (pSVar1->lockword_).super___atomic_base<int>._M_i == 0;
      if (bVar3) {
        (pSVar1->lockword_).super___atomic_base<int>._M_i = 1;
      }
      UNLOCK();
      if (!bVar3) {
        SpinLock::SlowLock(pSVar1);
      }
      uVar2 = uVar2 + 1;
      pSVar1 = pSVar1 + 0x130;
    } while (uVar2 < DAT_00145490);
  }
  pSVar1 = ThreadCachePtr::GetSlowTLSLock();
  LOCK();
  bVar3 = (pSVar1->lockword_).super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (pSVar1->lockword_).super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar3) {
    SpinLock::SlowLock(pSVar1);
  }
  pSVar1 = GetSysAllocLock();
  LOCK();
  bVar3 = (pSVar1->lockword_).super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (pSVar1->lockword_).super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar3) {
    SpinLock::SlowLock(pSVar1);
    return;
  }
  return;
}

Assistant:

void CentralCacheLockAll() NO_THREAD_SAFETY_ANALYSIS
{
  Static::pageheap_lock()->Lock();
  for (int i = 0; i < Static::num_size_classes(); ++i)
    Static::central_cache()[i].Lock();
  ThreadCachePtr::GetSlowTLSLock()->Lock();
  GetSysAllocLock()->Lock();
}